

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::FormatStrSS<std::__cxx11::stringstream,char[18],unsigned_int,char[3],unsigned_int>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [18],uint *RestArgs,char (*RestArgs_1) [3],uint *RestArgs_2)

{
  uint *RestArgs_local_2;
  char (*RestArgs_local_1) [3];
  uint *RestArgs_local;
  char (*FirstArg_local) [18];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[18]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_int,char[3],unsigned_int>
            (ss,RestArgs,RestArgs_1,RestArgs_2);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}